

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O3

int decode_one(MMDB_s *mmdb,uint32_t offset,MMDB_entry_data_s *entry_data)

{
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  undefined1 *in_RCX;
  ulong uVar5;
  uint uVar6;
  ushort uVar7;
  uint uVar8;
  byte *pbVar9;
  uint uVar10;
  uint uVar11;
  double dVar12;
  
  uVar11 = offset - 1;
  uVar8 = (uint)entry_data;
  if (uVar11 < uVar8) {
    return 7;
  }
  *(uint *)(in_RCX + 0x20) = uVar8;
  *in_RCX = 1;
  uVar6 = uVar8 + 1;
  bVar1 = *(byte *)((long)&mmdb->flags + ((ulong)entry_data & 0xffffffff));
  uVar4 = (uint)bVar1;
  if (bVar1 < 0x20) {
    if (uVar11 < uVar6) {
      return 7;
    }
    uVar10 = *(byte *)((long)&mmdb->flags + (ulong)uVar6) + 7;
    *(uint *)(in_RCX + 0x2c) = uVar10;
    uVar6 = uVar8 + 2;
  }
  else {
    uVar10 = (uint)(bVar1 >> 5);
    *(uint *)(in_RCX + 0x2c) = uVar10;
    if (uVar10 == 1) {
      uVar11 = bVar1 >> 3 & 3;
      uVar8 = uVar11 + 1;
      if (offset - uVar8 < uVar6 || offset < uVar8) {
        return 7;
      }
      uVar3 = (ulong)uVar6;
      switch(uVar11) {
      case 0:
        uVar11 = (uint)*(byte *)((long)&mmdb->flags + uVar3) | (uVar4 & 7) << 8;
        break;
      case 1:
        uVar11 = (uint)*(byte *)((long)&mmdb->flags + uVar3 + 1) +
                 ((uint)*(byte *)((long)&mmdb->flags + uVar3) << 8 | (uVar4 & 7) << 0x10) + 0x800;
        break;
      case 2:
        uVar11 = ((uint)*(byte *)((long)&mmdb->flags + uVar3 + 2) |
                 (uint)*(byte *)((long)&mmdb->flags + uVar3 + 1) << 8 |
                 (uint)*(byte *)((long)&mmdb->flags + uVar3) << 0x10) +
                 (uint)(bVar1 & 7) * 0x1000000 + 0x80800;
        break;
      case 3:
        uVar11 = *(uint *)((long)&mmdb->flags + uVar3);
        uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18
        ;
      }
      *(uint *)(in_RCX + 0x10) = uVar11;
      *(uint *)(in_RCX + 0x28) = uVar8;
      uVar6 = uVar6 + uVar8;
      goto LAB_00103a26;
    }
  }
  uVar4 = uVar4 & 0x1f;
  if (uVar4 == 0x1f) {
    if (offset - 3 < uVar6) {
      return 7;
    }
    uVar3 = (ulong)uVar6;
    uVar4 = (uint)*(byte *)((long)&mmdb->flags + uVar3 + 2) +
            ((uint)*(byte *)((long)&mmdb->flags + uVar3 + 1) << 8 |
            (uint)*(byte *)((long)&mmdb->flags + uVar3) << 0x10) + 0x1011d;
    uVar6 = uVar6 + 3;
  }
  else if (uVar4 == 0x1e) {
    if (offset - 2 < uVar6) {
      return 7;
    }
    uVar7 = *(ushort *)((long)&mmdb->flags + (ulong)uVar6);
    uVar4 = (ushort)(uVar7 << 8 | uVar7 >> 8) + 0x11d;
    uVar6 = uVar6 + 2;
  }
  else if (uVar4 == 0x1d) {
    if (uVar11 < uVar6) {
      return 7;
    }
    uVar3 = (ulong)uVar6;
    uVar6 = uVar6 + 1;
    uVar4 = *(byte *)((long)&mmdb->flags + uVar3) + 0x1d;
  }
  if (uVar10 == 7) {
LAB_0010396a:
    *(uint *)(in_RCX + 0x28) = uVar4;
    goto LAB_00103a26;
  }
  if (uVar10 == 0xe) {
    in_RCX[0x10] = uVar4 != 0;
    *(undefined4 *)(in_RCX + 0x28) = 0;
    goto LAB_00103a26;
  }
  if (uVar10 == 0xb) goto LAB_0010396a;
  if (offset - uVar4 < uVar6 || offset < uVar4) {
    return 7;
  }
  switch(uVar10) {
  case 2:
    pcVar2 = "";
    if (uVar4 != 0) {
      pcVar2 = (char *)((long)&mmdb->flags + (ulong)uVar6);
    }
    *(char **)(in_RCX + 0x10) = pcVar2;
    goto LAB_00103a3b;
  case 3:
    if (uVar4 != 8) {
      return 7;
    }
    dVar12 = get_ieee754_double((uint8_t *)((long)&mmdb->flags + (ulong)uVar6));
    *(double *)(in_RCX + 0x10) = dVar12;
    uVar4 = 8;
    break;
  case 4:
    *(ulong *)(in_RCX + 0x10) = (long)&mmdb->flags + (ulong)uVar6;
LAB_00103a3b:
    *(uint *)(in_RCX + 0x28) = uVar4;
    break;
  case 5:
    if (2 < uVar4) {
      return 7;
    }
    if (uVar4 == 0) {
      uVar7 = 0;
    }
    else {
      pbVar9 = (byte *)((long)&mmdb->flags + (ulong)uVar6);
      uVar8 = uVar4 + 1;
      uVar7 = 0;
      do {
        bVar1 = *pbVar9;
        pbVar9 = pbVar9 + 1;
        uVar7 = (ushort)bVar1 | uVar7 << 8;
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
    }
    *(ushort *)(in_RCX + 0x10) = uVar7;
    break;
  case 6:
    if (4 < uVar4) {
      return 7;
    }
    if (uVar4 == 0) {
LAB_00103b98:
      uVar11 = 0;
    }
    else {
      pbVar9 = (byte *)((long)&mmdb->flags + (ulong)uVar6);
      uVar8 = uVar4 + 1;
      uVar11 = 0;
      do {
        bVar1 = *pbVar9;
        pbVar9 = pbVar9 + 1;
        uVar11 = uVar11 << 8 | (uint)bVar1;
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
    }
    goto LAB_00103b9a;
  case 8:
    if (4 < uVar4) {
      return 7;
    }
    if (uVar4 == 0) goto LAB_00103b98;
    pbVar9 = (byte *)((long)&mmdb->flags + (ulong)uVar6);
    uVar8 = uVar4 + 1;
    uVar11 = 0;
    do {
      bVar1 = *pbVar9;
      pbVar9 = pbVar9 + 1;
      uVar11 = uVar11 << 8 | (uint)bVar1;
      uVar8 = uVar8 - 1;
    } while (1 < uVar8);
LAB_00103b9a:
    *(uint *)(in_RCX + 0x10) = uVar11;
    break;
  case 9:
    if (8 < uVar4) {
      return 7;
    }
    if (uVar4 == 0) {
      uVar3 = 0;
    }
    else {
      pbVar9 = (byte *)((long)&mmdb->flags + (ulong)uVar6);
      uVar8 = uVar4 + 1;
      uVar3 = 0;
      do {
        bVar1 = *pbVar9;
        pbVar9 = pbVar9 + 1;
        uVar3 = uVar3 << 8 | (ulong)bVar1;
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
    }
    goto LAB_00103bab;
  case 10:
    if (0x10 < uVar4) {
      return 7;
    }
    if (uVar4 == 0) {
      uVar3 = 0;
      uVar5 = 0;
    }
    else {
      pbVar9 = (byte *)((long)&mmdb->flags + (ulong)uVar6);
      uVar8 = uVar4 + 1;
      uVar3 = 0;
      uVar5 = 0;
      do {
        uVar5 = uVar5 << 8 | uVar3 >> 0x38;
        bVar1 = *pbVar9;
        pbVar9 = pbVar9 + 1;
        uVar3 = (ulong)bVar1 | uVar3 << 8;
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
    }
    *(ulong *)(in_RCX + 0x18) = uVar5;
LAB_00103bab:
    *(ulong *)(in_RCX + 0x10) = uVar3;
    break;
  case 0xf:
    if (uVar4 != 4) {
      return 7;
    }
    uVar3 = (ulong)uVar6;
    *(uint *)(in_RCX + 0x10) =
         CONCAT31(CONCAT21(CONCAT11(*(undefined1 *)((long)&mmdb->flags + uVar3),
                                    *(undefined1 *)((long)&mmdb->flags + uVar3 + 1)),
                           *(undefined1 *)((long)&mmdb->flags + uVar3 + 2)),
                  *(undefined1 *)((long)&mmdb->flags + uVar3 + 3));
    uVar4 = 4;
  }
  uVar6 = uVar6 + uVar4;
LAB_00103a26:
  *(uint *)(in_RCX + 0x24) = uVar6;
  return 0;
}

Assistant:

static int decode_one(const MMDB_s *const mmdb,
                      uint32_t offset,
                      MMDB_entry_data_s *entry_data) {
    const uint8_t *mem = mmdb->data_section;

    // We subtract rather than add as it possible that offset + 1
    // could overflow for a corrupt database while an underflow
    // from data_section_size - 1 should not be possible.
    if (offset > mmdb->data_section_size - 1) {
        DEBUG_MSGF("Offset (%d) past data section (%d)",
                   offset,
                   mmdb->data_section_size);
        return MMDB_INVALID_DATA_ERROR;
    }

    entry_data->offset = offset;
    entry_data->has_data = true;

    DEBUG_NL;
    DEBUG_MSGF("Offset: %i", offset);

    uint8_t ctrl = mem[offset++];
    DEBUG_BINARY("Control byte: %s", ctrl);

    int type = (ctrl >> 5) & 7;
    DEBUG_MSGF("Type: %i (%s)", type, type_num_to_name(type));

    if (type == MMDB_DATA_TYPE_EXTENDED) {
        // Subtracting 1 to avoid possible overflow on offset + 1
        if (offset > mmdb->data_section_size - 1) {
            DEBUG_MSGF("Extended type offset (%d) past data section (%d)",
                       offset,
                       mmdb->data_section_size);
            return MMDB_INVALID_DATA_ERROR;
        }
        type = get_ext_type(mem[offset++]);
        DEBUG_MSGF("Extended type: %i (%s)", type, type_num_to_name(type));
    }

    entry_data->type = (uint32_t)type;

    if (type == MMDB_DATA_TYPE_POINTER) {
        uint8_t psize = ((ctrl >> 3) & 3) + 1;
        DEBUG_MSGF("Pointer size: %i", psize);

        // We check that the offset does not extend past the end of the
        // database and that the subtraction of psize did not underflow.
        if (offset > mmdb->data_section_size - psize ||
            mmdb->data_section_size < psize) {
            DEBUG_MSGF("Pointer offset (%d) past data section (%d)",
                       offset + psize,
                       mmdb->data_section_size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->pointer = get_ptr_from(ctrl, &mem[offset], psize);
        DEBUG_MSGF("Pointer to: %i", entry_data->pointer);

        entry_data->data_size = psize;
        entry_data->offset_to_next = offset + psize;
        return MMDB_SUCCESS;
    }

    uint32_t size = ctrl & 31;
    switch (size) {
        case 29:
            // We subtract when checking offset to avoid possible overflow
            if (offset > mmdb->data_section_size - 1) {
                DEBUG_MSGF("String end (%d, case 29) past data section (%d)",
                           offset,
                           mmdb->data_section_size);
                return MMDB_INVALID_DATA_ERROR;
            }
            size = 29 + mem[offset++];
            break;
        case 30:
            // We subtract when checking offset to avoid possible overflow
            if (offset > mmdb->data_section_size - 2) {
                DEBUG_MSGF("String end (%d, case 30) past data section (%d)",
                           offset,
                           mmdb->data_section_size);
                return MMDB_INVALID_DATA_ERROR;
            }
            size = 285 + get_uint16(&mem[offset]);
            offset += 2;
            break;
        case 31:
            // We subtract when checking offset to avoid possible overflow
            if (offset > mmdb->data_section_size - 3) {
                DEBUG_MSGF("String end (%d, case 31) past data section (%d)",
                           offset,
                           mmdb->data_section_size);
                return MMDB_INVALID_DATA_ERROR;
            }
            size = 65821 + get_uint24(&mem[offset]);
            offset += 3;
            break;
        default:
            break;
    }

    DEBUG_MSGF("Size: %i", size);

    if (type == MMDB_DATA_TYPE_MAP || type == MMDB_DATA_TYPE_ARRAY) {
        entry_data->data_size = size;
        entry_data->offset_to_next = offset;
        return MMDB_SUCCESS;
    }

    if (type == MMDB_DATA_TYPE_BOOLEAN) {
        entry_data->boolean = size ? true : false;
        entry_data->data_size = 0;
        entry_data->offset_to_next = offset;
        DEBUG_MSGF("boolean value: %s", entry_data->boolean ? "true" : "false");
        return MMDB_SUCCESS;
    }

    // Check that the data doesn't extend past the end of the memory
    // buffer and that the calculation in doing this did not underflow.
    if (offset > mmdb->data_section_size - size ||
        mmdb->data_section_size < size) {
        DEBUG_MSGF("Data end (%d) past data section (%d)",
                   offset + size,
                   mmdb->data_section_size);
        return MMDB_INVALID_DATA_ERROR;
    }

    if (type == MMDB_DATA_TYPE_UINT16) {
        if (size > 2) {
            DEBUG_MSGF("uint16 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->uint16 = (uint16_t)get_uintX(&mem[offset], (int)size);
        DEBUG_MSGF("uint16 value: %u", entry_data->uint16);
    } else if (type == MMDB_DATA_TYPE_UINT32) {
        if (size > 4) {
            DEBUG_MSGF("uint32 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->uint32 = (uint32_t)get_uintX(&mem[offset], (int)size);
        DEBUG_MSGF("uint32 value: %u", entry_data->uint32);
    } else if (type == MMDB_DATA_TYPE_INT32) {
        if (size > 4) {
            DEBUG_MSGF("int32 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->int32 = get_sintX(&mem[offset], (int)size);
        DEBUG_MSGF("int32 value: %i", entry_data->int32);
    } else if (type == MMDB_DATA_TYPE_UINT64) {
        if (size > 8) {
            DEBUG_MSGF("uint64 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        entry_data->uint64 = get_uintX(&mem[offset], (int)size);
        DEBUG_MSGF("uint64 value: %" PRIu64, entry_data->uint64);
    } else if (type == MMDB_DATA_TYPE_UINT128) {
        if (size > 16) {
            DEBUG_MSGF("uint128 of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
#if MMDB_UINT128_IS_BYTE_ARRAY
        memset(entry_data->uint128, 0, 16);
        if (size > 0) {
            memcpy(entry_data->uint128 + 16 - size, &mem[offset], size);
        }
#else
        entry_data->uint128 = get_uint128(&mem[offset], (int)size);
#endif
    } else if (type == MMDB_DATA_TYPE_FLOAT) {
        if (size != 4) {
            DEBUG_MSGF("float of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        size = 4;
        entry_data->float_value = get_ieee754_float(&mem[offset]);
        DEBUG_MSGF("float value: %f", entry_data->float_value);
    } else if (type == MMDB_DATA_TYPE_DOUBLE) {
        if (size != 8) {
            DEBUG_MSGF("double of size %d", size);
            return MMDB_INVALID_DATA_ERROR;
        }
        size = 8;
        entry_data->double_value = get_ieee754_double(&mem[offset]);
        DEBUG_MSGF("double value: %f", entry_data->double_value);
    } else if (type == MMDB_DATA_TYPE_UTF8_STRING) {
        entry_data->utf8_string = size == 0 ? "" : (char const *)&mem[offset];
        entry_data->data_size = size;
#ifdef MMDB_DEBUG
        char *string =
            mmdb_strndup(entry_data->utf8_string, size > 50 ? 50 : size);
        if (NULL == string) {
            abort();
        }
        DEBUG_MSGF("string value: %s", string);
        free(string);
#endif
    } else if (type == MMDB_DATA_TYPE_BYTES) {
        entry_data->bytes = &mem[offset];
        entry_data->data_size = size;
    }

    entry_data->offset_to_next = offset + size;

    return MMDB_SUCCESS;
}